

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_stream.hpp
# Opt level: O1

void __thiscall
libtorrent::ssl_stream<libtorrent::utp_stream>::
async_connect<std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (ssl_stream<libtorrent::utp_stream> *this,endpoint_type *endpoint,
          _Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *handler)

{
  shared_ptr<std::function<void_(const_boost::system::error_code_&)>_> h;
  function<void_(const_boost::system::error_code_&)> *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  _Bind<void_(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
  local_50;
  
  local_60 = (function<void_(const_boost::system::error_code_&)> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::function<void(boost::system::error_code_const&)>,std::allocator<std::function<void(boost::system::error_code_const&)>>,std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>const&>
            (&local_58,&local_60,
             (allocator<std::function<void_(const_boost::system::error_code_&)>_> *)&local_50,
             handler);
  local_50._M_f = (offset_in_ssl_stream<libtorrent::utp_stream>_to_subr)connected;
  local_50._8_8_ = 0;
  local_50._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
  .
  super__Tuple_impl<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
  .
  super__Head_base<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>,_false>
  ._M_head_impl.
  super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_60;
  local_50._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
  .
  super__Tuple_impl<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
  .
  super__Head_base<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>,_false>
  ._M_head_impl.
  super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_58._M_pi;
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
    }
  }
  local_50._M_bound_args.
  super__Tuple_impl<0UL,_libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
  .super__Head_base<0UL,_libtorrent::ssl_stream<libtorrent::utp_stream>_*,_false>._M_head_impl =
       this;
  utp_stream::
  async_connect<std::_Bind<void(libtorrent::ssl_stream<libtorrent::utp_stream>::*(libtorrent::ssl_stream<libtorrent::utp_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>
            ((utp_stream *)this,endpoint,&local_50);
  if (local_50._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
      .
      super__Tuple_impl<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
      .
      super__Head_base<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>,_false>
      ._M_head_impl.
      super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50._M_bound_args.
               super__Tuple_impl<0UL,_libtorrent::ssl_stream<libtorrent::utp_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
               .
               super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
               .
               super__Tuple_impl<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>_>
               .
               super__Head_base<2UL,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>,_false>
               ._M_head_impl.
               super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  return;
}

Assistant:

void async_connect(endpoint_type const& endpoint, Handler const& handler)
	{
		// the connect is split up in the following steps:
		// 1. connect to peer
		// 2. perform SSL client handshake

		// to avoid unnecessary copying of the handler,
		// store it in a shared_ptr
		auto h = std::make_shared<handler_type>(handler);

		using std::placeholders::_1;
		m_sock.next_layer().async_connect(endpoint
			, std::bind(&ssl_stream::connected, this, _1, h));
	}